

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O2

int ncnn::reduction_post_process<ncnn::post_process_identity<float>>(Mat *a,float coeff,Option *opt)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  int i;
  ulong uVar10;
  
  iVar1 = a->dims;
  if (iVar1 == 2) {
    uVar4 = a->h * a->w;
    pvVar7 = a->data;
    uVar8 = 0;
    uVar6 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar6 = uVar8;
    }
    for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
      *(float *)((long)pvVar7 + uVar8 * 4) = *(float *)((long)pvVar7 + uVar8 * 4) * coeff;
    }
  }
  else if (iVar1 == 1) {
    pvVar7 = a->data;
    uVar8 = 0;
    uVar6 = (ulong)(uint)a->w;
    if (a->w < 1) {
      uVar6 = uVar8;
    }
    for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
      *(float *)((long)pvVar7 + uVar8 * 4) = *(float *)((long)pvVar7 + uVar8 * 4) * coeff;
    }
  }
  else {
    uVar6 = (ulong)(iVar1 - 3U);
    if (iVar1 - 3U < 2) {
      uVar4 = a->c;
      uVar5 = a->h * a->w * a->d;
      pvVar7 = a->data;
      if (uVar4 == 1) {
        uVar8 = 0;
        uVar6 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar6 = uVar8;
        }
        for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
          *(float *)((long)pvVar7 + uVar8 * 4) = *(float *)((long)pvVar7 + uVar8 * 4) * coeff;
        }
      }
      else {
        sVar2 = a->cstep;
        sVar3 = a->elemsize;
        uVar8 = 0;
        uVar6 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar6 = uVar8;
        }
        uVar9 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar9 = uVar8;
        }
        for (; uVar8 != uVar9; uVar8 = uVar8 + 1) {
          for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
            *(float *)((long)pvVar7 + uVar10 * 4) = *(float *)((long)pvVar7 + uVar10 * 4) * coeff;
          }
          pvVar7 = (void *)((long)pvVar7 + sVar2 * sVar3);
        }
      }
    }
  }
  return (int)uVar6;
}

Assistant:

static int reduction_post_process(Mat& a, float coeff, const Option& opt)
{
    MathOp mathop;

    int dims = a.dims;
    if (dims == 1)
    {
        int w = a.w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < w; i++)
            a[i] = mathop(a[i]) * coeff;
    }
    else if (dims == 2)
    {
        int size = a.w * a.h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
            a[i] = mathop(a[i]) * coeff;
    }
    else if (dims == 3 || dims == 4)
    {
        int c = a.c;
        int size = a.w * a.h * a.d;
        if (c == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < size; i++)
                a[i] = mathop(a[i]) * coeff;
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < c; q++)
            {
                float* outptr = a.channel(q);
                for (int i = 0; i < size; i++)
                    outptr[i] = mathop(outptr[i]) * coeff;
            }
        }
    }

    return 0;
}